

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O3

void av1_get_horver_correlation_full_c
               (int16_t *diff,int stride,int width,int height,float *hcorr,float *vcorr)

{
  short sVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  short *psVar7;
  long lVar8;
  int16_t *piVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  short *psVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  iVar3 = (int)*diff;
  lVar18 = (long)iVar3;
  uVar15 = (ulong)(uint)(iVar3 * iVar3);
  uVar2 = (ulong)(uint)width;
  uVar4 = uVar15;
  lVar16 = lVar18;
  uVar17 = uVar15;
  lVar20 = lVar18;
  if (width < 2) {
    lVar19 = 0;
  }
  else {
    uVar5 = 1;
    lVar19 = 0;
    do {
      iVar3 = (int)diff[uVar5];
      lVar8 = (long)iVar3;
      lVar20 = lVar20 + lVar8;
      lVar16 = lVar16 + lVar8;
      uVar17 = uVar17 + (uint)(iVar3 * iVar3);
      uVar4 = uVar4 + (uint)(iVar3 * iVar3);
      lVar19 = lVar19 + diff[uVar5 - 1] * lVar8;
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  uVar5 = (ulong)(uint)height;
  if (height < 2) {
    lVar8 = 0;
  }
  else {
    lVar6 = uVar5 - 1;
    lVar8 = 0;
    piVar9 = diff;
    do {
      iVar3 = (int)piVar9[stride];
      sVar1 = *piVar9;
      piVar9 = piVar9 + stride;
      lVar12 = (long)iVar3;
      lVar20 = lVar20 + lVar12;
      lVar18 = lVar18 + lVar12;
      uVar17 = uVar17 + (uint)(iVar3 * iVar3);
      uVar15 = uVar15 + (uint)(iVar3 * iVar3);
      lVar8 = lVar8 + sVar1 * lVar12;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    if (1 < height) {
      psVar7 = diff + 1;
      uVar10 = 1;
      do {
        lVar6 = uVar2 - 1;
        psVar13 = psVar7;
        if (1 < width) {
          do {
            iVar3 = (int)psVar13[stride];
            lVar12 = (long)iVar3;
            lVar20 = lVar20 + lVar12;
            uVar17 = uVar17 + (uint)(iVar3 * iVar3);
            lVar19 = lVar19 + psVar13[(long)stride + -1] * lVar12;
            lVar8 = lVar8 + *psVar13 * lVar12;
            psVar13 = psVar13 + 1;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        uVar10 = uVar10 + 1;
        psVar7 = psVar7 + stride;
      } while (uVar10 != uVar5);
    }
  }
  if (width < 1) {
    lVar12 = 0;
    lVar6 = 0;
  }
  else {
    uVar10 = 0;
    lVar6 = 0;
    lVar12 = 0;
    do {
      iVar3 = (int)diff[(long)((height + -1) * stride) + uVar10];
      lVar6 = lVar6 + iVar3;
      lVar12 = lVar12 + (ulong)(uint)(iVar3 * iVar3);
      uVar10 = uVar10 + 1;
    } while (uVar2 != uVar10);
  }
  if (height < 1) {
    lVar11 = 0;
    lVar14 = 0;
  }
  else {
    psVar7 = diff + (long)width + -1;
    lVar14 = 0;
    lVar11 = 0;
    do {
      iVar3 = (int)*psVar7;
      lVar14 = lVar14 + iVar3;
      lVar11 = lVar11 + (ulong)(uint)(iVar3 * iVar3);
      psVar7 = psVar7 + stride;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  lVar14 = lVar20 - lVar14;
  fVar22 = (float)((width + -1) * height);
  lVar6 = lVar20 - lVar6;
  fVar25 = (float)((height + -1) * width);
  fVar23 = (float)(long)(uVar17 - lVar11) - (float)(lVar14 * lVar14) / fVar22;
  fVar26 = (float)(long)(uVar17 - lVar12) - (float)(lVar6 * lVar6) / fVar25;
  fVar24 = 1.0;
  if (0.0 < fVar23) {
    lVar18 = lVar20 - lVar18;
    fVar21 = (float)(long)(uVar17 - uVar15) - (float)(lVar18 * lVar18) / fVar22;
    fVar24 = 1.0;
    if (0.0 < fVar21) {
      fVar21 = fVar21 * fVar23;
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      fVar21 = ((float)lVar19 - (float)(lVar14 * lVar18) / fVar22) / fVar21;
      fVar24 = 0.0;
      if (0.0 <= fVar21) {
        fVar24 = fVar21;
      }
    }
  }
  *hcorr = fVar24;
  fVar24 = 1.0;
  if (0.0 < fVar26) {
    lVar20 = lVar20 - lVar16;
    fVar22 = (float)(long)(uVar17 - uVar4) - (float)(lVar20 * lVar20) / fVar25;
    if (0.0 < fVar22) {
      fVar22 = fVar22 * fVar26;
      if (fVar22 < 0.0) {
        fVar22 = sqrtf(fVar22);
      }
      else {
        fVar22 = SQRT(fVar22);
      }
      fVar22 = ((float)lVar8 - (float)(lVar6 * lVar20) / fVar25) / fVar22;
      fVar24 = 0.0;
      if (0.0 <= fVar22) {
        fVar24 = fVar22;
      }
    }
  }
  *vcorr = fVar24;
  return;
}

Assistant:

void av1_get_horver_correlation_full_c(const int16_t *diff, int stride,
                                       int width, int height, float *hcorr,
                                       float *vcorr) {
  // The following notation is used:
  // x - current pixel
  // y - left neighbor pixel
  // z - top neighbor pixel
  int64_t x_sum = 0, x2_sum = 0, xy_sum = 0, xz_sum = 0;
  int64_t x_firstrow = 0, x_finalrow = 0, x_firstcol = 0, x_finalcol = 0;
  int64_t x2_firstrow = 0, x2_finalrow = 0, x2_firstcol = 0, x2_finalcol = 0;

  // First, process horizontal correlation on just the first row
  x_sum += diff[0];
  x2_sum += diff[0] * diff[0];
  x_firstrow += diff[0];
  x2_firstrow += diff[0] * diff[0];
  for (int j = 1; j < width; ++j) {
    const int16_t x = diff[j];
    const int16_t y = diff[j - 1];
    x_sum += x;
    x_firstrow += x;
    x2_sum += x * x;
    x2_firstrow += x * x;
    xy_sum += x * y;
  }

  // Process vertical correlation in the first column
  x_firstcol += diff[0];
  x2_firstcol += diff[0] * diff[0];
  for (int i = 1; i < height; ++i) {
    const int16_t x = diff[i * stride];
    const int16_t z = diff[(i - 1) * stride];
    x_sum += x;
    x_firstcol += x;
    x2_sum += x * x;
    x2_firstcol += x * x;
    xz_sum += x * z;
  }

  // Now process horiz and vert correlation through the rest unit
  for (int i = 1; i < height; ++i) {
    for (int j = 1; j < width; ++j) {
      const int16_t x = diff[i * stride + j];
      const int16_t y = diff[i * stride + j - 1];
      const int16_t z = diff[(i - 1) * stride + j];
      x_sum += x;
      x2_sum += x * x;
      xy_sum += x * y;
      xz_sum += x * z;
    }
  }

  for (int j = 0; j < width; ++j) {
    x_finalrow += diff[(height - 1) * stride + j];
    x2_finalrow +=
        diff[(height - 1) * stride + j] * diff[(height - 1) * stride + j];
  }
  for (int i = 0; i < height; ++i) {
    x_finalcol += diff[i * stride + width - 1];
    x2_finalcol += diff[i * stride + width - 1] * diff[i * stride + width - 1];
  }

  int64_t xhor_sum = x_sum - x_finalcol;
  int64_t xver_sum = x_sum - x_finalrow;
  int64_t y_sum = x_sum - x_firstcol;
  int64_t z_sum = x_sum - x_firstrow;
  int64_t x2hor_sum = x2_sum - x2_finalcol;
  int64_t x2ver_sum = x2_sum - x2_finalrow;
  int64_t y2_sum = x2_sum - x2_firstcol;
  int64_t z2_sum = x2_sum - x2_firstrow;

  const float num_hor = (float)(height * (width - 1));
  const float num_ver = (float)((height - 1) * width);

  const float xhor_var_n = x2hor_sum - (xhor_sum * xhor_sum) / num_hor;
  const float xver_var_n = x2ver_sum - (xver_sum * xver_sum) / num_ver;

  const float y_var_n = y2_sum - (y_sum * y_sum) / num_hor;
  const float z_var_n = z2_sum - (z_sum * z_sum) / num_ver;

  const float xy_var_n = xy_sum - (xhor_sum * y_sum) / num_hor;
  const float xz_var_n = xz_sum - (xver_sum * z_sum) / num_ver;

  if (xhor_var_n > 0 && y_var_n > 0) {
    *hcorr = xy_var_n / sqrtf(xhor_var_n * y_var_n);
    *hcorr = *hcorr < 0 ? 0 : *hcorr;
  } else {
    *hcorr = 1.0;
  }
  if (xver_var_n > 0 && z_var_n > 0) {
    *vcorr = xz_var_n / sqrtf(xver_var_n * z_var_n);
    *vcorr = *vcorr < 0 ? 0 : *vcorr;
  } else {
    *vcorr = 1.0;
  }
}